

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

CharClass * __thiscall re2::CharClassBuilder::GetCharClass(CharClassBuilder *this)

{
  CharClass *pCVar1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  
  pCVar1 = CharClass::New((int)(this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  lVar3 = 0;
  for (p_Var2 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    *(undefined8 *)(*(long *)(pCVar1 + 8) + lVar3 * 8) = *(undefined8 *)(p_Var2 + 1);
    lVar3 = lVar3 + 1;
  }
  *(int *)(pCVar1 + 0x10) = (int)lVar3;
  if ((int)lVar3 <= (int)(this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    *(int *)(pCVar1 + 4) = this->nrunes_;
    *pCVar1 = (CharClass)(((this->lower_ ^ this->upper_) & 0x3ffffff) == 0);
    return pCVar1;
  }
  __assert_fail("(n) <= (static_cast<int>(ranges_.size()))",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",
                0x3a1,"CharClass *re2::CharClassBuilder::GetCharClass()");
}

Assistant:

CharClass* CharClassBuilder::GetCharClass() {
  CharClass* cc = CharClass::New(static_cast<int>(ranges_.size()));
  int n = 0;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_[n++] = *it;
  cc->nranges_ = n;
  DCHECK_LE(n, static_cast<int>(ranges_.size()));
  cc->nrunes_ = nrunes_;
  cc->folds_ascii_ = FoldsASCII();
  return cc;
}